

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,void **vtt,initializer_list<long_double> *list)

{
  size_type sVar1;
  ulong uVar2;
  iterator plVar3;
  longdouble *plVar4;
  ulong uVar5;
  
  sVar1 = list->_M_len;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = sVar1;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 1;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar2 = list->_M_len;
  if (uVar2 != 0) {
    plVar4 = (longdouble *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 << 4);
    this->fElem = plVar4;
    plVar3 = list->_M_array;
    uVar5 = 0;
    do {
      *(unkbyte10 *)((long)plVar4 + uVar5) = *(unkbyte10 *)((long)plVar3 + uVar5);
      uVar5 = uVar5 + 0x10;
    } while (uVar2 << 4 != uVar5);
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<TVar>& list) 
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>(list.size(), 1)
{
	if (list.size() > 0) {
		this->fElem = new TVar[list.size()];
	}

	auto it = list.begin();
	auto it_end = list.end();
	TVar* aux = fElem;
	for (; it != it_end; it++, aux++)
		*aux = *it;
}